

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O3

int ncnn::reduction_op_keepdims<ncnn::reduction_op_sumsq<float>,std::plus<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  float fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  Allocator *pAVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  void *pvVar12;
  long lVar13;
  void *pvVar14;
  uint uVar15;
  int *piVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  void *pvVar20;
  ulong uVar21;
  bool bVar22;
  ulong uVar23;
  ulong uVar24;
  float fVar25;
  void *ptr;
  Mat local_78;
  
  sVar3 = a->elemsize;
  iVar2 = a->dims;
  if (iVar2 == 3) {
    uVar11 = a->w;
    uVar21 = (ulong)uVar11;
    uVar9 = a->h;
    uVar19 = (ulong)uVar9;
    iVar2 = a->c;
    lVar13 = (long)iVar2;
    uVar15 = uVar9 * uVar11;
    bVar22 = !reduce_w;
    bVar8 = !reduce_h;
    if ((bVar22 || bVar8) || !reduce_c) {
      if ((!bVar22 && !bVar8) && !reduce_c) {
        Mat::create(b,1,1,iVar2,sVar3,opt->blob_allocator);
        if (0 < iVar2) {
          pvVar12 = a->data;
          sVar3 = a->cstep;
          pvVar14 = b->data;
          sVar4 = b->cstep;
          sVar5 = b->elemsize;
          sVar6 = a->elemsize;
          lVar17 = 0;
          do {
            fVar25 = 0.0;
            if (0 < (int)uVar15) {
              uVar21 = 0;
              do {
                fVar1 = *(float *)((long)pvVar12 + uVar21 * 4);
                fVar25 = fVar25 + fVar1 * fVar1;
                uVar21 = uVar21 + 1;
              } while (uVar15 != uVar21);
            }
            *(float *)((long)pvVar14 + sVar4 * sVar5 * lVar17) = fVar25;
            lVar17 = lVar17 + 1;
            pvVar12 = (void *)((long)pvVar12 + sVar3 * sVar6);
          } while (lVar17 != lVar13);
          return 0;
        }
        return 0;
      }
      lVar17 = (long)(int)uVar11;
      if ((!bVar22 && !reduce_h) && !reduce_c) {
        Mat::create(b,1,uVar9,iVar2,sVar3,opt->blob_allocator);
        if (0 < iVar2) {
          pvVar12 = a->data;
          sVar3 = a->cstep;
          sVar4 = b->cstep;
          sVar5 = b->elemsize;
          sVar6 = a->elemsize;
          pvVar14 = b->data;
          lVar18 = 0;
          do {
            if (0 < (int)uVar9) {
              uVar23 = 0;
              pvVar20 = pvVar12;
              do {
                fVar25 = 0.0;
                if (0 < (int)uVar11) {
                  uVar24 = 0;
                  do {
                    fVar1 = *(float *)((long)pvVar20 + uVar24 * 4);
                    fVar25 = fVar25 + fVar1 * fVar1;
                    uVar24 = uVar24 + 1;
                  } while (uVar21 != uVar24);
                }
                *(float *)((long)pvVar14 + uVar23 * 4 + sVar4 * sVar5 * lVar18) = fVar25;
                uVar23 = uVar23 + 1;
                pvVar20 = (void *)((long)pvVar20 + lVar17 * 4);
              } while (uVar23 != uVar19);
            }
            lVar18 = lVar18 + 1;
            pvVar12 = (void *)((long)pvVar12 + sVar3 * sVar6);
          } while (lVar18 != lVar13);
          return 0;
        }
        return 0;
      }
      if ((!bVar22 && !reduce_h) && reduce_c) {
        Mat::create(b,1,uVar9,1,sVar3,opt->blob_allocator);
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.c = 0;
        local_78.cstep = 0;
        Mat::create(&local_78,1,uVar9,iVar2,sVar3,opt->workspace_allocator);
        pvVar12 = local_78.data;
        iVar10 = -100;
        if ((local_78.data == (void *)0x0) || (local_78.cstep * (long)local_78.c == 0))
        goto LAB_001425ef;
        uVar15 = (int)local_78.cstep * local_78.c;
        if (0 < (int)uVar15) {
          memset(local_78.data,0,(ulong)uVar15 << 2);
        }
        if (0 < iVar2) {
          sVar3 = a->cstep;
          sVar4 = a->elemsize;
          pvVar14 = a->data;
          lVar18 = 0;
          do {
            if (0 < (int)uVar9) {
              uVar23 = 0;
              pvVar20 = pvVar14;
              do {
                fVar25 = 0.0;
                if (0 < (int)uVar11) {
                  uVar24 = 0;
                  do {
                    fVar1 = *(float *)((long)pvVar20 + uVar24 * 4);
                    fVar25 = fVar25 + fVar1 * fVar1;
                    uVar24 = uVar24 + 1;
                  } while (uVar21 != uVar24);
                }
                *(float *)((long)pvVar12 +
                          uVar23 * 4 +
                          local_78.cstep *
                          CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) * lVar18)
                     = fVar25;
                uVar23 = uVar23 + 1;
                pvVar20 = (void *)((long)pvVar20 + lVar17 * 4);
              } while (uVar23 != uVar19);
            }
            lVar18 = lVar18 + 1;
            pvVar14 = (void *)((long)pvVar14 + sVar3 * sVar4);
          } while (lVar18 != lVar13);
        }
        uVar11 = b->c * (int)b->cstep;
        if (0 < (int)uVar11) {
          memset(b->data,0,(ulong)uVar11 << 2);
        }
        if (0 < iVar2) {
          pvVar12 = b->data;
          lVar17 = 0;
          pvVar14 = local_78.data;
          do {
            if (0 < (int)uVar9) {
              uVar21 = 0;
              do {
                *(float *)((long)pvVar12 + uVar21 * 4) =
                     *(float *)((long)pvVar14 + uVar21 * 4) + *(float *)((long)pvVar12 + uVar21 * 4)
                ;
                uVar21 = uVar21 + 1;
              } while (uVar19 != uVar21);
            }
            lVar17 = lVar17 + 1;
            pvVar14 = (void *)((long)pvVar14 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (lVar17 != lVar13);
        }
      }
      else {
        if ((bVar8 || reduce_w) || !reduce_c) {
          if ((!reduce_w && !reduce_h) && reduce_c) {
            Mat::create(b,uVar11,uVar9,1,sVar3,opt->blob_allocator);
            uVar11 = b->c * (int)b->cstep;
            if (0 < (int)uVar11) {
              memset(b->data,0,(ulong)uVar11 << 2);
            }
            if (0 < iVar2) {
              sVar3 = a->cstep;
              sVar4 = a->elemsize;
              pvVar12 = a->data;
              pvVar14 = b->data;
              lVar17 = 0;
              do {
                if (0 < (int)uVar15) {
                  uVar21 = 0;
                  do {
                    fVar25 = *(float *)((long)pvVar12 + uVar21 * 4);
                    *(float *)((long)pvVar14 + uVar21 * 4) =
                         fVar25 * fVar25 + *(float *)((long)pvVar14 + uVar21 * 4);
                    uVar21 = uVar21 + 1;
                  } while (uVar15 != uVar21);
                }
                lVar17 = lVar17 + 1;
                pvVar12 = (void *)((long)pvVar12 + sVar3 * sVar4);
              } while (lVar17 != lVar13);
              return 0;
            }
            return 0;
          }
          if ((bVar8 || reduce_w) || reduce_c) {
            return 0;
          }
          Mat::create(b,uVar11,1,iVar2,sVar3,opt->blob_allocator);
          sVar3 = b->cstep;
          uVar15 = b->c * (int)sVar3;
          if (0 < (int)uVar15) {
            memset(b->data,0,(ulong)uVar15 << 2);
          }
          if (0 < iVar2) {
            pvVar12 = a->data;
            sVar4 = a->cstep;
            pvVar14 = b->data;
            sVar5 = a->elemsize;
            sVar6 = b->elemsize;
            lVar18 = 0;
            do {
              if (0 < (int)uVar9) {
                uVar15 = 0;
                pvVar20 = pvVar12;
                do {
                  if (0 < (int)uVar11) {
                    uVar19 = 0;
                    do {
                      fVar25 = *(float *)((long)pvVar20 + uVar19 * 4);
                      *(float *)((long)pvVar14 + uVar19 * 4) =
                           fVar25 * fVar25 + *(float *)((long)pvVar14 + uVar19 * 4);
                      uVar19 = uVar19 + 1;
                    } while (uVar21 != uVar19);
                  }
                  uVar15 = uVar15 + 1;
                  pvVar20 = (void *)((long)pvVar20 + lVar17 * 4);
                } while (uVar15 != uVar9);
              }
              lVar18 = lVar18 + 1;
              pvVar12 = (void *)((long)pvVar12 + sVar4 * sVar5);
              pvVar14 = (void *)((long)pvVar14 + sVar3 * sVar6);
            } while (lVar18 != lVar13);
            return 0;
          }
          return 0;
        }
        Mat::create(b,uVar11,1,1,sVar3,opt->blob_allocator);
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.c = 0;
        local_78.cstep = 0;
        Mat::create(&local_78,uVar11,1,iVar2,sVar3,opt->workspace_allocator);
        pvVar12 = local_78.data;
        iVar10 = -100;
        if ((local_78.data == (void *)0x0) || (local_78.cstep * (long)local_78.c == 0))
        goto LAB_001425ef;
        uVar15 = (int)local_78.cstep * local_78.c;
        if (0 < (int)uVar15) {
          memset(local_78.data,0,(ulong)uVar15 << 2);
        }
        if (0 < iVar2) {
          pvVar14 = a->data;
          sVar3 = a->cstep;
          sVar4 = a->elemsize;
          lVar18 = 0;
          do {
            if (0 < (int)uVar9) {
              uVar15 = 0;
              pvVar20 = pvVar14;
              do {
                if (0 < (int)uVar11) {
                  uVar19 = 0;
                  do {
                    fVar25 = *(float *)((long)pvVar20 + uVar19 * 4);
                    *(float *)((long)pvVar12 + uVar19 * 4) =
                         fVar25 * fVar25 + *(float *)((long)pvVar12 + uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  } while (uVar21 != uVar19);
                }
                uVar15 = uVar15 + 1;
                pvVar20 = (void *)((long)pvVar20 + lVar17 * 4);
              } while (uVar15 != uVar9);
            }
            lVar18 = lVar18 + 1;
            pvVar14 = (void *)((long)pvVar14 + sVar3 * sVar4);
            pvVar12 = (void *)((long)pvVar12 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (lVar18 != lVar13);
        }
        uVar9 = b->c * (int)b->cstep;
        if (0 < (int)uVar9) {
          memset(b->data,0,(ulong)uVar9 << 2);
        }
        if (0 < iVar2) {
          pvVar12 = b->data;
          lVar17 = 0;
          pvVar14 = local_78.data;
          do {
            if (0 < (int)uVar11) {
              uVar19 = 0;
              do {
                *(float *)((long)pvVar12 + uVar19 * 4) =
                     *(float *)((long)pvVar14 + uVar19 * 4) + *(float *)((long)pvVar12 + uVar19 * 4)
                ;
                uVar19 = uVar19 + 1;
              } while (uVar21 != uVar19);
            }
            lVar17 = lVar17 + 1;
            pvVar14 = (void *)((long)pvVar14 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (lVar17 != lVar13);
        }
      }
      iVar10 = 0;
LAB_001425ef:
      Mat::~Mat(&local_78);
      return iVar10;
    }
    Mat::create(b,1,1,1,sVar3,opt->blob_allocator);
    if (iVar2 == 0) {
      return -100;
    }
    pAVar7 = opt->workspace_allocator;
    uVar21 = sVar3 * lVar13 + 3 & 0xfffffffffffffffc;
    if (pAVar7 == (Allocator *)0x0) {
      local_78.data = (void *)0x0;
      iVar10 = posix_memalign(&local_78.data,0x10,uVar21 + 4);
      pvVar12 = (void *)0x0;
      if (iVar10 == 0) {
        pvVar12 = local_78.data;
      }
    }
    else {
      pvVar12 = (void *)(**(code **)(*(long *)pAVar7 + 0x10))();
    }
    *(undefined4 *)((long)pvVar12 + uVar21) = 1;
    if (iVar2 < 1) {
LAB_0014228a:
      fVar25 = 0.0;
    }
    else {
      pvVar14 = a->data;
      sVar3 = a->cstep;
      sVar4 = a->elemsize;
      lVar17 = 0;
      do {
        fVar25 = 0.0;
        if (0 < (int)uVar15) {
          uVar19 = 0;
          do {
            fVar1 = *(float *)((long)pvVar14 + uVar19 * 4);
            fVar25 = fVar25 + fVar1 * fVar1;
            uVar19 = uVar19 + 1;
          } while (uVar15 != uVar19);
        }
        *(float *)((long)pvVar12 + lVar17 * 4) = fVar25;
        lVar17 = lVar17 + 1;
        pvVar14 = (void *)((long)pvVar14 + sVar3 * sVar4);
      } while (lVar17 != lVar13);
      if (iVar2 < 1) goto LAB_0014228a;
      fVar25 = 0.0;
      lVar17 = 0;
      do {
        fVar25 = fVar25 + *(float *)((long)pvVar12 + lVar17 * 4);
        lVar17 = lVar17 + 1;
      } while (lVar13 != lVar17);
    }
    *(float *)b->data = fVar25;
    LOCK();
    piVar16 = (int *)((long)pvVar12 + uVar21);
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 != 0) {
      return 0;
    }
    if (pAVar7 != (Allocator *)0x0) {
      (**(code **)(*(long *)pAVar7 + 0x18))(pAVar7,pvVar12);
      return 0;
    }
    goto LAB_0014244f;
  }
  if (iVar2 != 2) {
    if (iVar2 == 1) {
      iVar2 = a->w;
      Mat::create(b,1,sVar3,opt->blob_allocator);
      if ((long)iVar2 < 1) {
        fVar25 = 0.0;
      }
      else {
        fVar25 = 0.0;
        lVar13 = 0;
        do {
          fVar1 = *(float *)((long)a->data + lVar13 * 4);
          fVar25 = fVar25 + fVar1 * fVar1;
          lVar13 = lVar13 + 1;
        } while (iVar2 != lVar13);
      }
      *(float *)b->data = fVar25;
      return 0;
    }
    return 0;
  }
  uVar11 = a->w;
  uVar21 = (ulong)uVar11;
  iVar2 = a->h;
  lVar13 = (long)iVar2;
  if (!reduce_w || !reduce_h) {
    if (reduce_w && !reduce_h) {
      Mat::create(b,1,iVar2,sVar3,opt->blob_allocator);
      if (0 < iVar2) {
        pvVar12 = a->data;
        iVar2 = a->w;
        pvVar14 = b->data;
        sVar3 = a->elemsize;
        lVar17 = 0;
        do {
          fVar25 = 0.0;
          if (0 < (int)uVar11) {
            uVar19 = 0;
            do {
              fVar1 = *(float *)((long)pvVar12 + uVar19 * 4);
              fVar25 = fVar25 + fVar1 * fVar1;
              uVar19 = uVar19 + 1;
            } while (uVar21 != uVar19);
          }
          *(float *)((long)pvVar14 + lVar17 * 4) = fVar25;
          lVar17 = lVar17 + 1;
          pvVar12 = (void *)((long)pvVar12 + (long)iVar2 * sVar3);
        } while (lVar17 != lVar13);
        return 0;
      }
      return 0;
    }
    if (!reduce_h || reduce_w) {
      return 0;
    }
    Mat::create(b,uVar11,1,sVar3,opt->blob_allocator);
    uVar9 = b->c * (int)b->cstep;
    if (0 < (int)uVar9) {
      memset(b->data,0,(ulong)uVar9 << 2);
    }
    if (0 < iVar2) {
      pvVar12 = a->data;
      iVar2 = a->w;
      pvVar14 = b->data;
      sVar3 = a->elemsize;
      lVar17 = 0;
      do {
        if (0 < (int)uVar11) {
          uVar19 = 0;
          do {
            fVar25 = *(float *)((long)pvVar12 + uVar19 * 4);
            *(float *)((long)pvVar14 + uVar19 * 4) =
                 fVar25 * fVar25 + *(float *)((long)pvVar14 + uVar19 * 4);
            uVar19 = uVar19 + 1;
          } while (uVar21 != uVar19);
        }
        lVar17 = lVar17 + 1;
        pvVar12 = (void *)((long)pvVar12 + (long)iVar2 * sVar3);
      } while (lVar17 != lVar13);
      return 0;
    }
    return 0;
  }
  Mat::create(b,1,1,sVar3,opt->blob_allocator);
  if (iVar2 == 0) {
    return -100;
  }
  pAVar7 = opt->workspace_allocator;
  piVar16 = (int *)(sVar3 * lVar13 + 3 & 0xfffffffffffffffc);
  if (pAVar7 == (Allocator *)0x0) {
    local_78.data = (void *)0x0;
    iVar10 = posix_memalign(&local_78.data,0x10,(size_t)(piVar16 + 1));
    pvVar12 = local_78.data;
    if (iVar10 != 0) {
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      return -100;
    }
  }
  else {
    pvVar12 = (void *)(**(code **)(*(long *)pAVar7 + 0x10))();
  }
  *(undefined4 *)((long)pvVar12 + (long)piVar16) = 1;
  if (iVar2 < 1) {
LAB_001420ee:
    fVar25 = 0.0;
  }
  else {
    pvVar14 = a->data;
    iVar10 = a->w;
    sVar3 = a->elemsize;
    lVar17 = 0;
    do {
      fVar25 = 0.0;
      if (0 < (int)uVar11) {
        uVar19 = 0;
        do {
          fVar1 = *(float *)((long)pvVar14 + uVar19 * 4);
          fVar25 = fVar25 + fVar1 * fVar1;
          uVar19 = uVar19 + 1;
        } while (uVar21 != uVar19);
      }
      *(float *)((long)pvVar12 + lVar17 * 4) = fVar25;
      lVar17 = lVar17 + 1;
      pvVar14 = (void *)((long)pvVar14 + (long)iVar10 * sVar3);
    } while (lVar17 != lVar13);
    if (iVar2 < 1) goto LAB_001420ee;
    fVar25 = 0.0;
    lVar17 = 0;
    do {
      fVar25 = fVar25 + *(float *)((long)pvVar12 + lVar17 * 4);
      lVar17 = lVar17 + 1;
    } while (lVar13 != lVar17);
  }
  *(float *)b->data = fVar25;
  LOCK();
  piVar16 = (int *)((long)pvVar12 + (long)piVar16);
  *piVar16 = *piVar16 + -1;
  UNLOCK();
  if (*piVar16 != 0) {
    return 0;
  }
  if (pAVar7 != (Allocator *)0x0) {
    (**(code **)(*(long *)pAVar7 + 0x18))(pAVar7,pvVar12);
    return 0;
  }
LAB_0014244f:
  free(pvVar12);
  return 0;
}

Assistant:

static int reduction_op_keepdims(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i=0; i<w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;

        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> 1 1
            b.create(1, 1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i=0; i<h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> 1 h
            b.create(1, h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }

            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w 1
            b.create(w, 1, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);
                for (int j=0; j<w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }

            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> 1 1 1
            b.create(1, 1, 1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i=0; i<channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> 1 1 c
            b.create(1, 1, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }

                outptr[0] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> 1 h c
            b.create(1, h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> 1 h 1
            b.create(1, h, 1, elemsize, opt.blob_allocator);

            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }
            
            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i=0; i<h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w 1 1
            b.create(w, 1, 1, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j=0; j<w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h 1
            b.create(w, h, 1, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i=0; i<size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w 1 c
            b.create(w, 1, channels, elemsize, opt.blob_allocator);
            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            return 0;
        }
    }

    return 0;
}